

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairedReadsDatastore.cc
# Opt level: O0

ostream * operator<<(ostream *os,PairedReadsDatastore *prds)

{
  ostream *poVar1;
  ulong uVar2;
  uint64_t uVar3;
  PairedReadsDatastore *in_RSI;
  ostream *in_RDI;
  bool bVar4;
  allocator local_31;
  string local_30 [32];
  PairedReadsDatastore *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar1 = std::operator<<(in_RDI,"Paired Reads Datastore ");
  uVar2 = std::__cxx11::string::empty();
  bVar4 = (uVar2 & 1) != 0;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"unnamed",&local_31);
  }
  else {
    std::__cxx11::string::string(local_30,(string *)&local_10->name);
  }
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,": ");
  uVar3 = PairedReadsDatastore::size(local_10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  std::operator<<(poVar1," reads");
  std::__cxx11::string::~string(local_30);
  if (bVar4) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const PairedReadsDatastore &prds) {
    os << "Paired Reads Datastore "<< (prds.name.empty() ? "unnamed" : prds.name ) << ": "<< prds.size() << " reads";
    return os;
}